

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

uint32 * rw::ps2::instanceRGBA(uint32 *p,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  RGBA *pRVar1;
  RGBA *pRVar2;
  uint8 uVar3;
  uint8 uVar4;
  uint8 uVar5;
  uint local_40;
  uint local_3c;
  uint32 i_1;
  uint32 i;
  uint32 *d;
  uint16 j;
  uint32 n_local;
  uint32 idx_local;
  Mesh *m_local;
  Geometry *g_local;
  uint32 *p_local;
  
  pRVar2 = g->colors;
  local_40 = idx;
  local_3c = idx;
  g_local = (Geometry *)p;
  if ((g->flags & 8) == 0) {
    for (; local_40 < idx + n; local_40 = local_40 + 1) {
      (g_local->object).type = '\0';
      (g_local->object).subType = '\0';
      (g_local->object).flags = '\0';
      (g_local->object).privateFlags = 0xff;
      g_local = (Geometry *)&(g_local->object).field_0x4;
    }
  }
  else {
    for (; local_3c < idx + n; local_3c = local_3c + 1) {
      pRVar1 = pRVar2 + m->indices[local_3c];
      uVar3 = pRVar1->green;
      uVar4 = pRVar1->blue;
      uVar5 = pRVar1->alpha;
      (g_local->object).type = pRVar1->red;
      (g_local->object).subType = uVar3;
      (g_local->object).flags = uVar4;
      (g_local->object).privateFlags = uVar5;
      g_local = (Geometry *)&(g_local->object).field_0x4;
    }
  }
  for (; ((ulong)g_local & 0xf) != 0; g_local = (Geometry *)&(g_local->object).field_0x4) {
    (g_local->object).type = '\0';
    (g_local->object).subType = '\0';
    (g_local->object).flags = '\0';
    (g_local->object).privateFlags = '\0';
  }
  return (uint32 *)g_local;
}

Assistant:

uint32*
instanceRGBA(uint32 *p, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	uint32 *d = (uint32*)g->colors;
	if((g->flags & Geometry::PRELIT))
		for(uint32 i = idx; i < idx+n; i++){
			j = m->indices[i];
			*p++ = d[j];
		}
	else
		for(uint32 i = idx; i < idx+n; i++)
			*p++ = 0xFF000000;
	while((uintptr)p % 0x10)
		*p++ = 0;
	return p;
}